

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O3

QSize __thiscall QtMWidgets::Switch::sizeHint(Switch *this)

{
  int iVar1;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar3;
  QSize QVar4;
  SwitchPrivate *pSVar5;
  QStyleOption opt;
  QStyleOption local_60 [32];
  QString local_40;
  
  QStyleOption::QStyleOption(local_60,1,0);
  QStyleOption::initFrom((QWidget *)local_60);
  iVar1 = QFontMetrics::ascent();
  pSVar5 = (this->d).d;
  pSVar5->radius = iVar1;
  iVar1 = 0;
  if ((pSVar5->offText).d.size == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = QFontMetrics::boundingRect(&local_40);
    iVar2 = (extraout_EDX - iVar2) + 1;
    pSVar5 = (this->d).d;
  }
  if ((pSVar5->onText).d.size != 0) {
    iVar1 = QFontMetrics::boundingRect(&local_40);
    iVar1 = (extraout_EDX_00 - iVar1) + 1;
    pSVar5 = (this->d).d;
  }
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  pSVar5->textWidth = iVar1;
  iVar2 = pSVar5->radius;
  iVar3 = iVar2 / 2 + iVar2 * 3 + iVar1;
  iVar1 = 0;
  if (AcceptedUncheck < pSVar5->state) {
    if (1 < pSVar5->state - NotAcceptedCheck) goto LAB_0016c069;
    iVar1 = iVar3 + iVar2 * -2;
  }
  pSVar5->offset = iVar1;
LAB_0016c069:
  QVar4.wd = iVar3 + 2;
  QStyleOption::~QStyleOption(local_60);
  QVar4.ht = iVar2 * 2 + 2;
  return QVar4;
}

Assistant:

QSize
Switch::sizeHint() const
{
	QStyleOption opt;
	opt.initFrom( this );

	d->radius = opt.fontMetrics.ascent();

	int offWidth = 0;
	int onWidth = 0;

	if( !d->offText.isEmpty() )
		offWidth = opt.fontMetrics.boundingRect( d->offText ).width();

	if( !d->onText.isEmpty() )
		onWidth = opt.fontMetrics.boundingRect( d->onText ).width();

	d->textWidth = qMax( offWidth, onWidth );

	const QRect r( 0, 0,
		d->textWidth + d->radius * 3 + d->radius / 2 + 2, d->radius * 2 + 2 );

	d->initOffset( r );

	return QSize( r.width(), r.height() );
}